

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StepFileImporter.cpp
# Opt level: O2

bool __thiscall
Assimp::StepFile::StepFileImporter::CanRead
          (StepFileImporter *this,string *file,IOSystem *pIOHandler,bool checkSig)

{
  bool bVar1;
  bool bVar2;
  string local_50;
  char *tokens [1];
  
  BaseImporter::GetExtension(&local_50,file);
  bVar1 = std::operator==(&local_50,"stp");
  bVar2 = true;
  if (bVar1) goto LAB_005560cb;
  bVar1 = std::operator==(&local_50,"step");
  if (bVar1) goto LAB_005560cb;
  if (local_50._M_string_length == 0) {
    if (pIOHandler != (IOSystem *)0x0) goto LAB_0055609f;
  }
  else if (pIOHandler != (IOSystem *)0x0 && checkSig) {
LAB_0055609f:
    tokens[0] = "ISO-10303-21";
    bVar2 = BaseImporter::SearchFileHeaderForToken(pIOHandler,file,tokens,1,200,false,false);
    goto LAB_005560cb;
  }
  bVar2 = false;
LAB_005560cb:
  std::__cxx11::string::~string((string *)&local_50);
  return bVar2;
}

Assistant:

bool StepFileImporter::CanRead(const std::string& file, IOSystem* pIOHandler, bool checkSig) const {
    const std::string &extension = GetExtension(file);
    if ( extension == "stp" || extension == "step" ) {
        return true;
    } else if ((!extension.length() || checkSig) && pIOHandler) {
        const char* tokens[] = { "ISO-10303-21" };
        const bool found(SearchFileHeaderForToken(pIOHandler, file, tokens, 1));
        return found;
    }

    return false;
}